

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O3

void __thiscall
t_javame_generator::generate_deep_copy_non_container
          (t_javame_generator *this,ostream *out,string *source_name,string *dest_name,t_type *type)

{
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  char *pcVar4;
  string local_48;
  
  iVar1 = (*(type->super_t_doc)._vptr_t_doc[5])(type);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(type->super_t_doc)._vptr_t_doc[10])(type);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(type->super_t_doc)._vptr_t_doc[9])(type);
      if ((char)iVar1 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(out,"new ",4);
        type_name_abi_cxx11_(&local_48,this,type,true,false,false);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_48._M_dataplus._M_p,local_48._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(",1);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(source_name->_M_dataplus)._M_p,source_name->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        return;
      }
    }
  }
  iVar1 = (*(type->super_t_doc)._vptr_t_doc[7])(type);
  if ((char)iVar1 == '\0') {
    pcVar4 = (source_name->_M_dataplus)._M_p;
    sVar3 = source_name->_M_string_length;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out,"new byte[",9);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(source_name->_M_dataplus)._M_p,source_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".length];",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar2 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"System.arraycopy(",0x11);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(source_name->_M_dataplus)._M_p,source_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", 0, ",5);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(dest_name->_M_dataplus)._M_p,dest_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", 0, ",5);
    out = std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,(source_name->_M_dataplus)._M_p,source_name->_M_string_length);
    pcVar4 = ".length)";
    sVar3 = 8;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar4,sVar3);
  return;
}

Assistant:

void t_javame_generator::generate_deep_copy_non_container(ostream& out,
                                                          std::string source_name,
                                                          std::string dest_name,
                                                          t_type* type) {
  if (type->is_base_type() || type->is_enum() || type->is_typedef()) {
    // binary fields need to be copied with System.arraycopy
    if (type->is_binary()) {
      out << "new byte[" << source_name << ".length];" << endl;
      indent(out) << "System.arraycopy(" << source_name << ", 0, " << dest_name << ", 0, "
                  << source_name << ".length)";
    }
    // everything else can be copied directly
    else
      out << source_name;
  } else {
    out << "new " << type_name(type, true, true) << "(" << source_name << ")";
  }
}